

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::replace(Fl_Input_ *this,int b,int e,char *text,int ilen)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  wchar_t local_5c;
  wchar_t local_58;
  wchar_t local_54;
  long local_50;
  long local_48;
  char *local_40;
  ulong local_38;
  
  if (b < 1) {
    b = 0;
  }
  was_up_down = 0;
  uVar9 = 0;
  if (0 < e) {
    uVar9 = e;
  }
  uVar2 = this->size_;
  if ((int)uVar2 <= b) {
    b = uVar2;
  }
  uVar4 = uVar2;
  if ((int)uVar9 < (int)uVar2) {
    uVar4 = uVar9;
  }
  uVar5 = uVar4;
  if ((int)uVar9 < b) {
    uVar5 = b;
  }
  uVar20 = (ulong)uVar5;
  uVar6 = b;
  if ((int)uVar9 < b) {
    uVar6 = uVar4;
  }
  uVar18 = (ulong)uVar6;
  if (((uVar4 != b) && (0 < (int)uVar6)) && ((int)uVar6 < (int)uVar2)) {
    uVar16 = uVar18;
    while ((iVar8 = fl_utf8len(this->value_[uVar16]), uVar18 = uVar16, iVar8 < 1 &&
           (uVar18 = uVar16 - 1, uVar20 + 1 != uVar16))) {
      if (((long)uVar16 < 2) || (bVar3 = (long)this->size_ < (long)uVar16, uVar16 = uVar18, bVar3))
      break;
    }
  }
  iVar8 = fl_utf8len(this->value_[(int)uVar5]);
  if ((0 < (int)uVar5) && (uVar16 = uVar20, (int)uVar5 < this->size_)) {
    do {
      uVar20 = uVar16;
      if (-1 < iVar8) break;
      uVar20 = uVar16 + 1;
      iVar8 = fl_utf8len(this->value_[uVar16 + 1]);
      iVar15 = (int)uVar16;
      uVar16 = uVar20;
    } while (iVar15 + 1 < this->size_);
  }
  if (ilen == 0 && text != (char *)0x0) {
    sVar12 = strlen(text);
    ilen = (int)sVar12;
  }
  iVar8 = (int)uVar20;
  if (ilen == 0 && iVar8 <= (int)uVar18) {
    return 0;
  }
  local_50 = (long)iVar8;
  uVar20 = (ulong)(uint)this->size_;
  uVar16 = 0;
  local_48 = (long)(int)uVar18;
  iVar15 = 0;
  if (0 < this->size_) {
    pcVar19 = this->value_;
    iVar15 = 0;
    pcVar14 = pcVar19;
    do {
      if (pcVar14 == pcVar19 + local_48) {
        if ((int)uVar20 <= iVar8) break;
        pcVar14 = pcVar19 + local_50;
      }
      uVar9 = fl_utf8len(*pcVar14);
      uVar20 = (ulong)uVar9;
      if ((int)uVar9 < 2) {
        uVar20 = 1;
      }
      iVar15 = iVar15 + 1;
      pcVar14 = pcVar14 + uVar20;
      pcVar19 = this->value_;
      uVar20 = (ulong)this->size_;
    } while (pcVar14 < pcVar19 + uVar20);
  }
  local_38 = uVar18;
  if ((0 < ilen) && (iVar15 < this->maximum_size_)) {
    uVar16 = 0;
    pcVar19 = text;
    do {
      iVar15 = iVar15 + 1;
      uVar9 = fl_utf8len(*pcVar19);
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      pcVar19 = pcVar19 + uVar9;
      uVar16 = (ulong)(uVar9 + (int)uVar16);
    } while ((pcVar19 < text + ilen) && (iVar15 < this->maximum_size_));
  }
  iVar11 = (int)uVar16;
  put_in_buffer(this,this->size_ + iVar11);
  uVar20 = local_38;
  lVar7 = local_48;
  iVar17 = (int)local_38;
  iVar15 = iVar8 - iVar17;
  if (iVar15 != 0 && iVar17 <= iVar8) {
    if ((undowidget == this) && (iVar17 == undoat)) {
      undobuffersize(undocut + iVar15);
      iVar10 = undocut;
      memcpy(undobuffer + undocut,this->value_ + lVar7,(long)iVar15);
LAB_001bc15a:
      undocut = iVar15 + iVar10;
      iVar10 = undoinsert;
    }
    else {
      if ((undowidget == this) && ((iVar8 == undoat && (undoinsert == 0)))) {
        undobuffersize(undocut + iVar15);
        iVar10 = undocut;
        local_40 = undobuffer;
        memmove(undobuffer + iVar15,undobuffer,(long)undocut);
        memcpy(local_40,this->value_ + lVar7,(long)iVar15);
        goto LAB_001bc15a;
      }
      if (((undowidget != this) || (iVar8 != undoat)) ||
         (iVar10 = undoinsert - iVar15, undoinsert - iVar15 == 0 || undoinsert < iVar15)) {
        undobuffersize(iVar15);
        memcpy(undobuffer,this->value_ + lVar7,(long)iVar15);
        undoinsert = 0;
        undocut = iVar15;
        iVar10 = undoinsert;
      }
    }
    undoinsert = iVar10;
    memmove(this->buffer + lVar7,this->buffer + local_50,(long)((this->size_ - iVar8) + 1));
    this->size_ = this->size_ + (iVar17 - iVar8);
    yankcut = 0;
    undowidget = this;
    undoat = iVar17;
    if (((this->super_Fl_Widget).type_ & 7) != 5) {
      yankcut = undocut;
    }
  }
  if (iVar11 != 0) {
    if ((undowidget == this) && (iVar17 == undoat)) {
      undoinsert = undoinsert + iVar11;
    }
    else {
      undocut = 0;
      undoinsert = iVar11;
    }
    memmove(this->buffer + lVar7 + uVar16,this->buffer + lVar7,(long)((this->size_ - iVar17) + 1));
    memcpy(this->buffer + lVar7,text,uVar16);
    this->size_ = this->size_ + iVar11;
  }
  iVar8 = this->position_;
  iVar15 = this->mark_;
  iVar10 = iVar11 + iVar17;
  undowidget = this;
  undoat = iVar10;
  this->position_ = iVar10;
  this->mark_ = iVar10;
  if (((this->super_Fl_Widget).type_ & 0x10) != 0) {
    sVar13 = 0;
    sVar12 = sVar13;
    if (iVar11 != 0) {
      do {
        sVar12 = sVar13;
        if (text[sVar13] == ' ') break;
        sVar13 = sVar13 + 1;
        sVar12 = uVar16;
      } while (uVar16 != sVar13);
    }
    if ((int)sVar12 == iVar11) {
      if (iVar17 < 1) goto LAB_001bc39b;
      uVar20 = uVar20 & 0xffffffff;
      do {
        local_5c = L'\0';
        uVar9 = fl_utf8decode(this->value_ + uVar20,this->value_ + this->size_,&local_5c);
        iVar11 = isspace(uVar9 & 0xff);
        if (iVar11 != 0) goto LAB_001bc39b;
        local_58 = L'\0';
        uVar9 = fl_utf8decode(this->value_ + uVar20,this->value_ + this->size_,&local_58);
        if (uVar9 == 10) goto LAB_001bc39b;
        bVar3 = 1 < (long)uVar20;
        uVar20 = uVar20 - 1;
      } while (bVar3);
    }
    else {
      if (iVar17 < 1) goto LAB_001bc39b;
      uVar20 = uVar20 & 0xffffffff;
      do {
        local_54 = L'\0';
        uVar9 = fl_utf8decode(this->value_ + uVar20,this->value_ + this->size_,&local_54);
        if (uVar9 == 10) goto LAB_001bc39b;
        bVar3 = 1 < (long)uVar20;
        uVar20 = uVar20 - 1;
      } while (bVar3);
    }
    uVar20 = 0;
  }
LAB_001bc39b:
  iVar11 = (int)uVar20;
  if (iVar15 < (int)uVar20) {
    iVar11 = iVar15;
  }
  if (iVar8 < iVar11) {
    iVar11 = iVar8;
  }
  minimal_update(this,iVar11);
  iVar8 = undoat;
  this->position_ = undoat;
  this->mark_ = iVar8;
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((this->super_Fl_Widget).when_ & 1) != 0) {
    Fl_Widget::do_callback
              (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_);
  }
  return 1;
}

Assistant:

int Fl_Input_::replace(int b, int e, const char* text, int ilen) {
  int ul, om, op;
  was_up_down = 0;

  if (b<0) b = 0;
  if (e<0) e = 0;
  if (b>size_) b = size_;
  if (e>size_) e = size_;
  if (e<b) {int t=b; b=e; e=t;}
  while (b != e && b > 0 && (size_ - b) > 0 &&
       (fl_utf8len((value_ + b)[0]) < 1)) { b--; }
  ul = fl_utf8len((char)(value_ + e)[0]);
  while (e < size_ && e > 0 && ul < 0) {
       e++;
       ul = fl_utf8len((char)(value_ + e)[0]);
  }
  if (text && !ilen) ilen = (int) strlen(text);
  if (e<=b && !ilen) return 0; // don't clobber undo for a null operation

  // we must count UTF-8 *characters* to determine whether we can insert
  // the full text or only a part of it (and how much this would be)

  int nchars = 0;	// characters in value() - deleted + inserted
  const char *p = value_;
  while (p < (char *)(value_+size_)) {
    if (p == (char *)(value_+b)) { // skip removed part
      p = (char *)(value_+e);
      if (p >= (char *)(value_+size_)) break;
    }
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
  }
  int nlen = 0;		// length (in bytes) to be inserted
  p = text;
  while (p < (char *)(text+ilen) && nchars < maximum_size()) {
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
    nlen += ulen;
  }
  ilen = nlen;

  put_in_buffer(size_+ilen);

  if (e>b) {
    if (undowidget == this && b == undoat) {
      undobuffersize(undocut+(e-b));
      memcpy(undobuffer+undocut, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && !undoinsert) {
      undobuffersize(undocut+(e-b));
      memmove(undobuffer+(e-b), undobuffer, undocut);
      memcpy(undobuffer, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && (e-b)<undoinsert) {
      undoinsert -= e-b;
    } else {
      undobuffersize(e-b);
      memcpy(undobuffer, value_+b, e-b);
      undocut = e-b;
      undoinsert = 0;
    }
    memmove(buffer+b, buffer+e, size_-e+1);
    size_ -= e-b;
    undowidget = this;
    undoat = b;
    if (input_type() == FL_SECRET_INPUT) yankcut = 0; else yankcut = undocut;
  }

  if (ilen) {
    if (undowidget == this && b == undoat)
      undoinsert += ilen;
    else {
      undocut = 0;
      undoinsert = ilen;
    }
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, text, ilen);
    size_ += ilen;
  }
  undowidget = this;
  om = mark_;
  op = position_;
  mark_ = position_ = undoat = b+ilen;

  // Insertions into the word at the end of the line will cause it to
  // wrap to the next line, so we must indicate that the changes may start
  // right after the whitespace before the current word.  This will
  // result in sub-optimal update when such wrapping does not happen
  // but it is too hard to figure out for now...
  if (wrap()) {
    // if there is a space in the pasted text, the whole line may have rewrapped
    int i;
    for (i=0; i<ilen; i++)
      if (text[i]==' ') break;
    if (i==ilen)
      while (b > 0 && !isspace(index(b) & 255) && index(b)!='\n') b--;
    else
      while (b > 0 && index(b)!='\n') b--;
  }

  // make sure we redraw the old selection or cursor:
  if (om < b) b = om;
  if (op < b) b = op;

  minimal_update(b);

  mark_ = position_ = undoat;

  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}